

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref __thiscall
cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
          (ValueBuilder *this,IString target,Ref args,Ref args_1,Ref args_2,Ref args_3)

{
  Ref RVar1;
  Ref RVar2;
  Ref r;
  Value *pVVar3;
  char *extraout_RDX;
  size_t i;
  long lVar4;
  IString name;
  Value *local_68;
  Ref argArray [4];
  
  name.str._M_len = target.str._M_len;
  RVar1 = makeRawArray(4);
  argArray[0] = args;
  argArray[1] = args_1;
  argArray[2] = args_2;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    Value::push_back(RVar1.inst,argArray[lVar4 + -1].inst);
  }
  RVar2 = makeRawArray(3);
  r = makeRawString((IString *)&CALL);
  pVVar3 = Value::push_back(RVar2.inst,r);
  name.str._M_str = extraout_RDX;
  RVar2 = makeName(this,name);
  pVVar3 = Value::push_back(pVVar3,RVar2);
  RVar1.inst = Value::push_back(pVVar3,RVar1);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeCall(IString target, Ts... args) {
    size_t nArgs = sizeof...(Ts);
    Ref callArgs = makeRawArray(nArgs);
    Ref argArray[] = {args...};
    for (size_t i = 0; i < nArgs; ++i) {
      callArgs->push_back(argArray[i]);
    }
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(makeName(target))
              .push_back(callArgs);
  }